

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1enc.c
# Opt level: O1

int jpc_enc_enccblks(jpc_enc_t *enc)

{
  jas_matrix_t *pjVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  jpc_enc_tcmpt_t *pjVar5;
  jpc_enc_rlvl_t *pjVar6;
  jpc_enc_band_t *pjVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  jpc_enc_cblk_t *cblk;
  jpc_enc_rlvl_t *pjVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  jpc_enc_prc_t *pjVar15;
  long lVar16;
  jpc_enc_band_t *band;
  jpc_enc_tcmpt_t *tcmpt;
  jpc_enc_cblk_t *pjVar17;
  
  uVar10 = (ulong)enc->curtile->numtcmpts;
  if (uVar10 != 0) {
    tcmpt = enc->curtile->tcmpts;
    pjVar5 = tcmpt + uVar10;
    do {
      if ((ulong)tcmpt->numrlvls != 0) {
        pjVar11 = tcmpt->rlvls;
        pjVar6 = pjVar11 + tcmpt->numrlvls;
        do {
          band = pjVar11->bands;
          if ((band != (jpc_enc_band_t *)0x0) && ((ulong)pjVar11->numbands != 0)) {
            pjVar7 = band + pjVar11->numbands;
            do {
              if ((band->data != (jas_matrix_t *)0x0) && (pjVar11->numprcs != 0)) {
                pjVar15 = band->prcs;
                uVar10 = 0;
                do {
                  cblk = pjVar15->cblks;
                  if ((cblk != (jpc_enc_cblk_t *)0x0) &&
                     (uVar8 = (ulong)pjVar15->numcblks, uVar8 != 0)) {
                    lVar16 = uVar8 * 0x68;
                    pjVar17 = cblk;
                    do {
                      pjVar1 = pjVar17->data;
                      if (pjVar1->numrows_ < 1) {
                        lVar9 = 0;
                      }
                      else {
                        lVar12 = 0;
                        lVar9 = 0;
                        do {
                          if (0 < pjVar1->numcols_) {
                            lVar14 = 0;
                            lVar13 = lVar9;
                            do {
                              lVar2 = pjVar1->rows_[lVar12][lVar14];
                              lVar9 = -lVar2;
                              if (0 < lVar2) {
                                lVar9 = lVar2;
                              }
                              if (lVar9 <= lVar13) {
                                lVar9 = lVar13;
                              }
                              lVar14 = lVar14 + 1;
                              lVar13 = lVar9;
                            } while (pjVar1->numcols_ != lVar14);
                          }
                          lVar12 = lVar12 + 1;
                        } while (lVar12 != pjVar1->numrows_);
                      }
                      iVar3 = jpc_fix_firstone(lVar9);
                      iVar4 = iVar3 + -5;
                      if (iVar3 < 6) {
                        iVar4 = 0;
                      }
                      pjVar17->numbps = iVar4;
                      pjVar17 = pjVar17 + 1;
                    } while (pjVar17 != cblk + uVar8);
                    iVar4 = band->numbps;
                    lVar9 = 0;
                    do {
                      iVar3 = iVar4 - *(int *)((long)&cblk->numbps + lVar9);
                      *(int *)((long)&cblk->numimsbs + lVar9) = iVar3;
                      if (iVar3 < 0) {
                        __assert_fail("cblk->numimsbs >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                      ,0xa1,"int jpc_enc_enccblks(jpc_enc_t *)");
                      }
                      lVar9 = lVar9 + 0x68;
                    } while (lVar16 - lVar9 != 0);
                    do {
                      iVar4 = jpc_enc_enccblk(tcmpt,band,cblk);
                      if (iVar4 != 0) {
                        return -1;
                      }
                      cblk = cblk + 1;
                      lVar16 = lVar16 + -0x68;
                    } while (lVar16 != 0);
                  }
                  uVar10 = uVar10 + 1;
                  pjVar15 = pjVar15 + 1;
                } while (uVar10 < pjVar11->numprcs);
              }
              band = band + 1;
            } while (band != pjVar7);
          }
          pjVar11 = pjVar11 + 1;
        } while (pjVar11 != pjVar6);
      }
      tcmpt = tcmpt + 1;
    } while (tcmpt != pjVar5);
  }
  return 0;
}

Assistant:

int jpc_enc_enccblks(jpc_enc_t *enc)
{
	jpc_enc_tcmpt_t *tcmpt;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_fix_t mx;
	jpc_fix_t bmx;
	jpc_fix_t v;
	jpc_enc_tile_t *tile;
	uint_fast32_t prcno;
	jpc_enc_prc_t *prc;

	tile = enc->curtile;

	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (tcmpt = tile->tcmpts; tcmpt != endcomps; ++tcmpt) {
		endlvls = &tcmpt->rlvls[tcmpt->numrlvls];
		for (lvl = tcmpt->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs; ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					bmx = 0;
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						mx = 0;
						for (jas_matind_t i = 0; i < jas_matrix_numrows(cblk->data); ++i) {
							for (jas_matind_t j = 0; j < jas_matrix_numcols(cblk->data); ++j) {
								v = JAS_ABS(jas_matrix_get(cblk->data, i, j));
								if (v > mx) {
									mx = v;
								}
							}
						}
						if (mx > bmx) {
							bmx = mx;
						}
						cblk->numbps = JAS_MAX(jpc_fix_firstone(mx) + 1 - JPC_NUMEXTRABITS, 0);
					}

					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						cblk->numimsbs = band->numbps - cblk->numbps;
						assert(cblk->numimsbs >= 0);
					}

					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						if (jpc_enc_enccblk(tcmpt, band, cblk)) {
							return -1;
						}
					}
				}
			}
		}
	}
	return 0;
}